

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IsGroupOf_PDU.cpp
# Opt level: O1

KBOOL __thiscall KDIS::PDU::IsGroupOf_PDU::operator==(IsGroupOf_PDU *this,IsGroupOf_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  
  KVar1 = Header7::operator!=(&this->super_Header,&Value->super_Header);
  if ((((!KVar1) &&
       (KVar1 = DATA_TYPE::EntityIdentifier::operator!=
                          (&this->m_GroupedEntityID,&Value->m_GroupedEntityID), !KVar1)) &&
      (this->m_ui8GrpdEntCat == Value->m_ui8GrpdEntCat)) &&
     (this->m_ui8NumOfGroupedEnts == Value->m_ui8NumOfGroupedEnts)) {
    if (((double)this->m_f64GrpLat == (double)Value->m_f64GrpLat) &&
       (!NAN((double)this->m_f64GrpLat) && !NAN((double)Value->m_f64GrpLat))) {
      if (((double)this->m_f64GrpLon == (double)Value->m_f64GrpLon) &&
         (!NAN((double)this->m_f64GrpLon) && !NAN((double)Value->m_f64GrpLon))) {
        bVar2 = std::operator!=(&this->m_vpGED,&Value->m_vpGED);
        return !bVar2;
      }
    }
  }
  return false;
}

Assistant:

KBOOL IsGroupOf_PDU::operator == ( const IsGroupOf_PDU & Value ) const
{
    if( Header::operator      !=( Value ) )                    return false;
    if( m_GroupedEntityID     != Value.m_GroupedEntityID )     return false;
    if( m_ui8GrpdEntCat       != Value.m_ui8GrpdEntCat )       return false;
    if( m_ui8NumOfGroupedEnts != Value.m_ui8NumOfGroupedEnts ) return false;
    if( m_f64GrpLat           != Value.m_f64GrpLat )           return false;
    if( m_f64GrpLon           != Value.m_f64GrpLon )           return false;
    if( m_vpGED               != Value.m_vpGED )               return false;
    return true;
}